

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O1

int lneedupdate(lua_State *L)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = lua_touserdata(L,1);
  if (*(void **)((long)pvVar2 + 8) == (void *)0x0) {
    iVar1 = 0;
  }
  else {
    lua_pushlightuserdata(L,*(void **)((long)pvVar2 + 8));
    lua_getuservalue(L,1);
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

static int
lneedupdate(lua_State *L) {
	struct ctrl * c = lua_touserdata(L, 1);
	if (c->update) {
		lua_pushlightuserdata(L, c->update);
		lua_getuservalue(L, 1);
		return 2;
	}
	return 0;
}